

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

void __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  string *psVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmLinkLineComputer *this_00;
  bool bVar4;
  __type _Var5;
  TargetType TVar6;
  ItemVector *pIVar7;
  cmLinkImplementation *pcVar8;
  string *psVar9;
  pointer this_01;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string local_178;
  string *local_158;
  cmComputeLinkInformation *local_150;
  cmLinkLineComputer *local_148;
  pointer local_140;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> linkLib;
  string config;
  string libPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_50;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar7 = cmComputeLinkInformation::GetItems(cli);
  psVar1 = &cli->Config;
  local_158 = stdLibString;
  local_150 = cli;
  local_148 = &this->super_cmLinkLineComputer;
  std::__cxx11::string::string((string *)&config,(string *)psVar1);
  this_01 = (pIVar7->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_140 = (pIVar7->
              super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  do {
    if (this_01 == local_140) {
      if ((pointer)local_158->_M_string_length != (pointer)0x0) {
        linkLib.Value._M_string_length = (size_type)(local_158->_M_dataplus)._M_p;
        libPath._M_string_length = (size_type)&libPath.field_2;
        libPath._M_dataplus._M_p = (pointer)0x1;
        libPath.field_2._M_local_buf[0] = ' ';
        linkLib.Value._M_dataplus._M_p = (pointer)local_158->_M_string_length;
        cmStrCat<>(&local_178,(cmAlphaNum *)&linkLib,(cmAlphaNum *)&libPath);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   linkLibraries,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
      }
      std::__cxx11::string::~string((string *)&config);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&emitted._M_t);
      return;
    }
    if (bVar4) {
LAB_003217fb:
      bVar4 = false;
    }
    else {
      if (this_01->Target != (cmGeneratorTarget *)0x0) {
        TVar6 = cmGeneratorTarget::GetType(this_01->Target);
        bVar4 = false;
        if (TVar6 - SHARED_LIBRARY < 2) goto LAB_00321b20;
        if (TVar6 == STATIC_LIBRARY) {
          pcVar2 = this_01->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&linkLib,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&libPath);
          bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&linkLib.Value);
          std::__cxx11::string::~string((string *)&linkLib);
          if (bVar4) goto LAB_003217fb;
        }
        else if (TVar6 == INTERFACE_LIBRARY) goto LAB_00321b20;
      }
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      local_138.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_138.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_138);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&linkLib,&local_120,(cmListFileBacktrace *)&local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_138.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_120);
      if (this_01->IsPath == Yes) {
        str._M_str = (this_01->Value).Value._M_dataplus._M_p;
        str._M_len = (this_01->Value).Value._M_string_length;
        bVar4 = cmHasLiteralSuffix<3ul>(str,(char (*) [3])0x5797bf);
        if ((bVar4) ||
           (str_00._M_str = (this_01->Value).Value._M_dataplus._M_p,
           str_00._M_len = (this_01->Value).Value._M_string_length,
           bVar4 = cmHasLiteralSuffix<5ul>(str_00,(char (*) [5])".lib"), bVar4)) {
          this_00 = local_148;
          (*local_148->_vptr_cmLinkLineComputer[2])(&local_50,local_148,this_01);
          cmLinkLineComputer::ConvertToOutputFormat(&local_178,this_00,&local_50);
          cmComputeLinkInformation::Item::GetFormattedItem
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&libPath,this_01,&local_178);
          std::__cxx11::string::operator=((string *)&linkLib,(string *)&libPath);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&libPath);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_50);
        }
LAB_00321a0c:
        pVar11 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&emitted,&linkLib.Value);
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::__cxx11::string::append((char *)&linkLib);
          pcVar2 = local_150->Target;
          std::__cxx11::string::string((string *)&libPath,(string *)psVar1);
          pcVar8 = cmGeneratorTarget::GetLinkImplementation(pcVar2,&libPath,Link);
          std::__cxx11::string::~string((string *)&libPath);
          pcVar3 = (pcVar8->super_cmLinkImplementationLibraries).Libraries.
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (p_Var10 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&(((pcVar8->super_cmLinkImplementationLibraries).Libraries.
                               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                               _M_impl.super__Vector_impl_data._M_start)->super_cmLinkItem).
                             Backtrace; (pointer)(p_Var10 + -3) != pcVar3;
              p_Var10 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         *)&p_Var10[4]._M_refcount) {
            if (((cmGeneratorTarget *)p_Var10[-1]._M_ptr != (cmGeneratorTarget *)0x0) &&
               (TVar6 = cmGeneratorTarget::GetType((cmGeneratorTarget *)p_Var10[-1]._M_ptr),
               TVar6 != INTERFACE_LIBRARY)) {
              pcVar2 = (cmGeneratorTarget *)p_Var10[-1]._M_ptr;
              std::__cxx11::string::string((string *)&local_178,(string *)psVar1);
              psVar9 = cmGeneratorTarget::GetLocation(pcVar2,&local_178);
              std::__cxx11::string::string((string *)&libPath,(string *)psVar9);
              std::__cxx11::string::~string((string *)&local_178);
              _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this_01,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&libPath);
              if (_Var5) {
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             *)&linkLib.Backtrace,p_Var10);
                std::__cxx11::string::~string((string *)&libPath);
                break;
              }
              std::__cxx11::string::~string((string *)&libPath);
            }
          }
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<BT<std::__cxx11::string>&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     linkLibraries,&linkLib);
        }
        bVar4 = false;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&libPath,"-framework",(allocator<char> *)&local_178);
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&libPath);
        std::__cxx11::string::~string((string *)&libPath);
        bVar4 = true;
        if (!_Var5) {
          str_01._M_str = (this_01->Value).Value._M_dataplus._M_p;
          str_01._M_len = (this_01->Value).Value._M_string_length;
          bVar4 = cmHasLiteralPrefix<2ul>(str_01,(char (*) [2])0x5a1548);
          if ((((!bVar4) ||
               (str_02._M_str = (this_01->Value).Value._M_dataplus._M_p,
               str_02._M_len = (this_01->Value).Value._M_string_length,
               bVar4 = cmHasLiteralPrefix<3ul>(str_02,(char (*) [3])0x595bcb), bVar4)) ||
              (str_03._M_str = (this_01->Value).Value._M_dataplus._M_p,
              str_03._M_len = (this_01->Value).Value._M_string_length,
              bVar4 = cmHasLiteralPrefix<3ul>(str_03,(char (*) [3])"-L"), bVar4)) ||
             (str_04._M_str = (this_01->Value).Value._M_dataplus._M_p,
             str_04._M_len = (this_01->Value).Value._M_string_length,
             bVar4 = cmHasLiteralPrefix<10ul>(str_04,(char (*) [10])"--library"), bVar4)) {
            std::__cxx11::string::_M_assign((string *)&linkLib);
          }
          goto LAB_00321a0c;
        }
      }
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&linkLib);
    }
LAB_00321b20:
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  // Note:
  // Any modification of this algorithm should be reflected also in
  // cmVisualStudio10TargetGenerator::ComputeCudaLinkOptions
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value.Value, ".a") ||
          cmHasLiteralSuffix(item.Value.Value, ".lib")) {
        linkLib.Value = item
                          .GetFormattedItem(this->ConvertToOutputFormat(
                            this->ConvertToLinkReference(item.Value.Value)))
                          .Value;
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value.Value)) {
      linkLib.Value = item.Value.Value;
    }

    if (emitted.insert(linkLib.Value).second) {
      linkLib.Value += " ";

      const cmLinkImplementation* linkImpl =
        cli.GetTarget()->GetLinkImplementation(
          cli.GetConfig(), cmGeneratorTarget::LinkInterfaceFor::Link);

      for (const cmLinkImplItem& iter : linkImpl->Libraries) {
        if (iter.Target != nullptr &&
            iter.Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
          std::string libPath = iter.Target->GetLocation(cli.GetConfig());
          if (item.Value == libPath) {
            linkLib.Backtrace = iter.Backtrace;
            break;
          }
        }
      }

      linkLibraries.emplace_back(linkLib);
    }
  }

  if (!stdLibString.empty()) {
    linkLibraries.emplace_back(cmStrCat(stdLibString, ' '));
  }
}